

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall re2::RE2::Init(RE2 *this,StringPiece *pattern,Options *options)

{
  string **this_00;
  bool bVar1;
  ParseFlags global_flags;
  RegexpStatusCode code;
  ErrorCode EVar2;
  Regexp *pRVar3;
  ostream *poVar4;
  RegexpStatus *this_01;
  int64_t iVar5;
  Prog *pPVar6;
  string *this_02;
  double __x;
  double __x_00;
  allocator local_439;
  StringPiece local_438;
  re2 local_428 [32];
  LogMessage local_408;
  Regexp *local_288;
  Regexp *suffix;
  StringPiece local_278 [2];
  RegexpStatus local_258;
  StringPiece local_238;
  re2 local_228 [32];
  LogMessage local_208;
  StringPiece local_78;
  undefined1 local_68 [8];
  RegexpStatus status;
  anon_class_1_0_00000001 local_21;
  Options *local_20;
  Options *options_local;
  StringPiece *pattern_local;
  RE2 *this_local;
  
  local_20 = options;
  options_local = (Options *)pattern;
  pattern_local = (StringPiece *)this;
  std::call_once<re2::RE2::Init(re2::StringPiece_const&,re2::RE2::Options_const&)::__0>
            (&Init::empty_once,&local_21);
  this_00 = &status.tmp_;
  StringPiece::as_string_abi_cxx11_((StringPiece *)this_00);
  std::__cxx11::string::operator=((string *)this,(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  Options::Copy(&this->options_,local_20);
  this->entire_regexp_ = (Regexp *)0x0;
  this->suffix_regexp_ = (Regexp *)0x0;
  this->prog_ = (Prog *)0x0;
  this->rprog_ = (Prog *)0x0;
  this->error_ = empty_string_abi_cxx11_;
  this->error_code_ = NoError;
  this->num_captures_ = -1;
  this->named_groups_ =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *)0x0;
  this->group_names_ =
       (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  RegexpStatus::RegexpStatus((RegexpStatus *)local_68);
  StringPiece::StringPiece(&local_78,&this->pattern_);
  global_flags = Options::ParseFlags(&this->options_);
  pRVar3 = Regexp::Parse(&local_78,global_flags,(RegexpStatus *)local_68);
  this->entire_regexp_ = pRVar3;
  if (this->entire_regexp_ == (Regexp *)0x0) {
    bVar1 = Options::log_errors(&this->options_);
    if (bVar1) {
      LogMessage::LogMessage
                (&local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0xbb,
                 2);
      poVar4 = LogMessage::stream(&local_208);
      poVar4 = std::operator<<(poVar4,"Error parsing \'");
      StringPiece::StringPiece(&local_238,&this->pattern_);
      trunc_abi_cxx11_(local_228,__x);
      poVar4 = std::operator<<(poVar4,(string *)local_228);
      poVar4 = std::operator<<(poVar4,"\': ");
      RegexpStatus::Text_abi_cxx11_(&local_258);
      std::operator<<(poVar4,(string *)&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)local_228);
      LogMessage::~LogMessage(&local_208);
    }
    this_01 = (RegexpStatus *)operator_new(0x20);
    RegexpStatus::Text_abi_cxx11_(this_01);
    this->error_ = (string *)this_01;
    code = RegexpStatus::code((RegexpStatus *)local_68);
    EVar2 = RegexpErrorToRE2(code);
    this->error_code_ = EVar2;
    RegexpStatus::error_arg((RegexpStatus *)local_68);
    StringPiece::as_string_abi_cxx11_(local_278);
    std::__cxx11::string::operator=((string *)&this->error_arg_,(string *)local_278);
    std::__cxx11::string::~string((string *)local_278);
    suffix._4_4_ = 1;
  }
  else {
    std::__cxx11::string::clear();
    this->prefix_foldcase_ = false;
    bVar1 = Regexp::RequiredPrefix
                      (this->entire_regexp_,&this->prefix_,&this->prefix_foldcase_,&local_288);
    if (bVar1) {
      this->suffix_regexp_ = local_288;
    }
    else {
      pRVar3 = Regexp::Incref(this->entire_regexp_);
      this->suffix_regexp_ = pRVar3;
    }
    pRVar3 = this->suffix_regexp_;
    iVar5 = Options::max_mem(&this->options_);
    pPVar6 = Regexp::CompileToProg(pRVar3,(iVar5 * 2) / 3);
    this->prog_ = pPVar6;
    if (this->prog_ == (Prog *)0x0) {
      bVar1 = Options::log_errors(&this->options_);
      if (bVar1) {
        LogMessage::LogMessage
                  (&local_408,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0xd2,2);
        poVar4 = LogMessage::stream(&local_408);
        poVar4 = std::operator<<(poVar4,"Error compiling \'");
        StringPiece::StringPiece(&local_438,&this->pattern_);
        trunc_abi_cxx11_(local_428,__x_00);
        poVar4 = std::operator<<(poVar4,(string *)local_428);
        std::operator<<(poVar4,"\'");
        std::__cxx11::string::~string((string *)local_428);
        LogMessage::~LogMessage(&local_408);
      }
      this_02 = (string *)operator_new(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this_02,"pattern too large - compile failed",&local_439);
      this->error_ = (string *)this_02;
      std::allocator<char>::~allocator((allocator<char> *)&local_439);
      this->error_code_ = ErrorPatternTooLarge;
      suffix._4_4_ = 1;
    }
    else {
      bVar1 = Prog::IsOnePass(this->prog_);
      this->is_one_pass_ = bVar1;
      suffix._4_4_ = 0;
    }
  }
  RegexpStatus::~RegexpStatus((RegexpStatus *)local_68);
  return;
}

Assistant:

void RE2::Init(const StringPiece& pattern, const Options& options) {
  static std::once_flag empty_once;
  std::call_once(empty_once, []() {
    empty_string = new string;
    empty_named_groups = new map<string, int>;
    empty_group_names = new map<int, string>;
  });

  pattern_ = pattern.as_string();
  options_.Copy(options);
  entire_regexp_ = NULL;
  suffix_regexp_ = NULL;
  prog_ = NULL;
  rprog_ = NULL;
  error_ = empty_string;
  error_code_ = NoError;
  num_captures_ = -1;
  named_groups_ = NULL;
  group_names_ = NULL;

  RegexpStatus status;
  entire_regexp_ = Regexp::Parse(
    pattern_,
    static_cast<Regexp::ParseFlags>(options_.ParseFlags()),
    &status);
  if (entire_regexp_ == NULL) {
    if (options_.log_errors()) {
      LOG(ERROR) << "Error parsing '" << trunc(pattern_) << "': "
                 << status.Text();
    }
    error_ = new string(status.Text());
    error_code_ = RegexpErrorToRE2(status.code());
    error_arg_ = status.error_arg().as_string();
    return;
  }

  prefix_.clear();
  prefix_foldcase_ = false;
  re2::Regexp* suffix;
  if (entire_regexp_->RequiredPrefix(&prefix_, &prefix_foldcase_, &suffix))
    suffix_regexp_ = suffix;
  else
    suffix_regexp_ = entire_regexp_->Incref();

  // Two thirds of the memory goes to the forward Prog,
  // one third to the reverse prog, because the forward
  // Prog has two DFAs but the reverse prog has one.
  prog_ = suffix_regexp_->CompileToProg(options_.max_mem()*2/3);
  if (prog_ == NULL) {
    if (options_.log_errors())
      LOG(ERROR) << "Error compiling '" << trunc(pattern_) << "'";
    error_ = new string("pattern too large - compile failed");
    error_code_ = RE2::ErrorPatternTooLarge;
    return;
  }

  // Could delay this until the first match call that
  // cares about submatch information, but the one-pass
  // machine's memory gets cut from the DFA memory budget,
  // and that is harder to do if the DFA has already
  // been built.
  is_one_pass_ = prog_->IsOnePass();
}